

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_GiveInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *receiver;
  PClass *pPVar1;
  int in_EAX;
  int iVar2;
  undefined4 extraout_var;
  char *__assertion;
  VMReturn *in_R9;
  bool bVar4;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003d0a98;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    receiver = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (receiver != (AActor *)0x0) {
        pPVar3 = (receiver->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(receiver->super_DThinker).super_DObject._vptr_DObject)(receiver);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (receiver->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar4) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar4 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d0a98;
        }
        bVar4 = DoGiveInventory(receiver,false,param,(TArray<VMValue,_VMValue> *)defaultparam->Array
                                ,numparam,in_R9,in_EAX);
        goto LAB_003d0a12;
      }
    }
    else if (receiver != (AActor *)0x0) goto LAB_003d0a41;
    bVar4 = DoGiveInventory((AActor *)0x0,false,param,
                            (TArray<VMValue,_VMValue> *)defaultparam->Array,numparam,in_R9,in_EAX);
LAB_003d0a12:
    if (numret < 1) {
      iVar2 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x97b,
                      "int AF_AActor_A_GiveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (ret->RegType != '\0') {
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                      ,0x13f,"void VMReturn::SetInt(int)");
      }
      *(uint *)ret->Location = (uint)bVar4;
      iVar2 = 1;
    }
    return iVar2;
  }
LAB_003d0a41:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003d0a98:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x97a,
                "int AF_AActor_A_GiveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_BOOL(DoGiveInventory(self, false, VM_ARGS_NAMES));
}